

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::initiatorFixtureHeartBeatInterval_TestRequestNeededHelper::
~initiatorFixtureHeartBeatInterval_TestRequestNeededHelper
          (initiatorFixtureHeartBeatInterval_TestRequestNeededHelper *this)

{
  sessionFixture::~sessionFixture((sessionFixture *)&this[-1].m_details);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, HeartBeatInterval_TestRequestNeeded) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);

  UtcTimeStamp time;

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  //Force Heartbeat Interval Flow
  process_sleep(2);

  object->next();
  CHECK_EQUAL(4, object->getExpectedSenderNum());
  CHECK(object->isLoggedOn());
}